

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirDEFINE(void)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  char *name;
  size_t sVar5;
  char *pcVar6;
  
  cVar1 = *lp;
  if (cVar1 == '+') {
    lp = lp + 1;
  }
  name = GetID(&lp);
  if (name == (char *)0x0) {
    Error("[DEFINE] Illegal <id>",lp,SUPPRESS);
    return;
  }
  bVar4 = White(*lp);
  if (bVar4) {
    lp = lp + 1;
  }
  pcVar2 = lp;
  if (eolComment != (char *)0x0) {
    sVar5 = strlen(lp);
    pcVar3 = pcVar2 + sVar5;
    do {
      pcVar6 = pcVar3;
      if (pcVar6 <= pcVar2) break;
      pcVar3 = pcVar6 + -1;
    } while (pcVar6[-1] == ' ');
    *pcVar6 = '\0';
  }
  if (cVar1 == '+') {
    CDefineTable::Replace(&DefineTable,name,lp);
  }
  else {
    CDefineTable::Add(&DefineTable,name,lp,(CStringsList *)0x0);
  }
  SkipToEol(&lp);
  substitutedLine = line;
  return;
}

Assistant:

static void dirDEFINE() {
	bool replaceEnabled = ('+' == *lp) ? ++lp, true : false;
	char* id = GetID(lp);
	if (nullptr == id) {
		Error("[DEFINE] Illegal <id>", lp, SUPPRESS);
		return;
	}
	if (White(*lp)) ++lp;		// skip one whitespace (not considered part of value) (others are)
	// but trim trailing spaces of value, if there's eol-comment
	if (eolComment) {
		char *rtrim = lp + strlen(lp);
		while (lp < rtrim && ' ' == rtrim[-1]) --rtrim;
		*rtrim = 0;
	}

	if (replaceEnabled) {
		DefineTable.Replace(id, lp);
	} else {
		DefineTable.Add(id, lp, nullptr);
	}
	SkipToEol(lp);
	substitutedLine = line;		// override substituted listing for DEFINE
}